

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O1

void __thiscall
google::protobuf::Reflection::VerifyFieldType<absl::lts_20250127::Cord*>
          (Reflection *this,FieldDescriptor *field)

{
  byte bVar1;
  int iVar2;
  CppStringType CVar3;
  Nonnull<const_char_*> pcVar4;
  bool v1;
  OneofDescriptor *pOVar5;
  size_type in_R9;
  UntypedFormatSpecImpl format;
  UntypedFormatSpecImpl format_00;
  UntypedFormatSpecImpl format_01;
  UntypedFormatSpecImpl format_02;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args_00;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args_01;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args_02;
  LogMessage LStack_78;
  string local_68;
  undefined8 local_48;
  char *local_40;
  ulong local_38;
  char *local_30;
  ulong *local_28;
  code *local_20;
  undefined8 *local_18;
  code *local_10;
  
  bVar1 = field->field_0x1;
  v1 = (bool)((bVar1 & 0x20) >> 5);
  if (0xbf < bVar1 == v1) {
    pcVar4 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                       (v1,0xbf < bVar1,
                        "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
  }
  if (pcVar4 != (Nonnull<const_char_*>)0x0) {
LAB_002b3cde:
    VerifyFieldType<absl::lts_20250127::Cord*>();
LAB_002b3ceb:
    internal::protobuf_assumption_failed
              ("res != nullptr",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
               ,0xb63);
  }
  if ((field->field_0x1 & 0x20) == 0) {
    pcVar4 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                       (true,false,"field->is_repeated() == internal::IsRepeatedT<T>");
  }
  if (pcVar4 != (Nonnull<const_char_*>)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&LStack_78,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message.h"
               ,0x6b3,pcVar4);
    local_30 = (field->all_names_).payload_;
    local_38 = (ulong)*(ushort *)(local_30 + 2);
    local_28 = &local_38;
    local_30 = local_30 + ~local_38;
    local_18 = &local_48;
    local_48 = 0x1b;
    local_40 = "PN4absl12lts_202501274CordE";
    local_20 = absl::lts_20250127::str_format_internal::FormatArgImpl::
               Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
    local_10 = absl::lts_20250127::str_format_internal::FormatArgImpl::
               Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
    format_00.size_ = (size_t)&local_28;
    format_00.data_ = (void *)0x1e;
    args_00.len_ = in_R9;
    args_00.ptr_ = (pointer)0x2;
    absl::lts_20250127::str_format_internal::FormatPack_abi_cxx11_
              (&local_68,(str_format_internal *)"Invalid cast of %s to type %s.",format_00,args_00);
    absl::lts_20250127::log_internal::LogMessage::operator<<(&LStack_78,&local_68);
    goto LAB_002b3c72;
  }
  iVar2 = 1;
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 8) {
    iVar2 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4);
  }
  if (iVar2 == 9) {
    pcVar4 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       ((long)iVar2,9,"+cpp_type == +internal::GetCppType<T>()");
  }
  if (pcVar4 != (Nonnull<const_char_*>)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&LStack_78,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message.h"
               ,0x6bf,pcVar4);
    local_30 = (field->all_names_).payload_;
    local_38 = (ulong)*(ushort *)(local_30 + 2);
    local_28 = &local_38;
    local_30 = local_30 + ~local_38;
    local_18 = &local_48;
    local_48 = 0x1b;
    local_40 = "PN4absl12lts_202501274CordE";
    local_20 = absl::lts_20250127::str_format_internal::FormatArgImpl::
               Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
    local_10 = absl::lts_20250127::str_format_internal::FormatArgImpl::
               Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
    format_01.size_ = (size_t)&local_28;
    format_01.data_ = (void *)0x1e;
    args_01.len_ = in_R9;
    args_01.ptr_ = (pointer)0x2;
    absl::lts_20250127::str_format_internal::FormatPack_abi_cxx11_
              (&local_68,(str_format_internal *)"Invalid cast of %s to type %s.",format_01,args_01);
    absl::lts_20250127::log_internal::LogMessage::operator<<(&LStack_78,&local_68);
    goto LAB_002b3c72;
  }
  CVar3 = FieldDescriptor::cpp_string_type(field);
  if (CVar3 != kCord) {
    if ((CVar3 != kView) && (CVar3 != kString)) {
      return;
    }
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&LStack_78,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message.h"
               ,0x6d5,
               "(std::is_same_v<T, internal::ArenaStringPtr> || std::is_same_v<T, RepeatedPtrField<std::string>>)"
              );
    local_30 = (field->all_names_).payload_;
    local_38 = (ulong)*(ushort *)(local_30 + 2);
    local_28 = &local_38;
    local_30 = local_30 + ~local_38;
    local_18 = &local_48;
    local_48 = 0x1b;
    local_40 = "PN4absl12lts_202501274CordE";
    local_20 = absl::lts_20250127::str_format_internal::FormatArgImpl::
               Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
    local_10 = absl::lts_20250127::str_format_internal::FormatArgImpl::
               Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
    format.size_ = (size_t)&local_28;
    format.data_ = (void *)0x1e;
    args.len_ = in_R9;
    args.ptr_ = (pointer)0x2;
    absl::lts_20250127::str_format_internal::FormatPack_abi_cxx11_
              (&local_68,(str_format_internal *)"Invalid cast of %s to type %s.",format,args);
    absl::lts_20250127::log_internal::LogMessage::operator<<(&LStack_78,&local_68);
    goto LAB_002b3c72;
  }
  if ((field->field_0x3 & 1) != 0) {
    if ((field->field_0x1 & 0x10) == 0) {
      pOVar5 = (OneofDescriptor *)0x0;
    }
    else {
      pOVar5 = (field->scope_).containing_oneof;
      if (pOVar5 == (OneofDescriptor *)0x0) {
        internal::protobuf_assumption_failed
                  ("res != nullptr",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xb31);
      }
    }
    if (pOVar5 == (OneofDescriptor *)0x0) goto LAB_002b3ceb;
    if ((pOVar5->field_count_ == 1) && ((pOVar5->fields_->field_0x1 & 2) != 0)) {
      VerifyFieldType<absl::lts_20250127::Cord*>();
      goto LAB_002b3cde;
    }
    if ((field->field_0x3 & 1) != 0) {
      return;
    }
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&LStack_78,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message.h"
             ,0x6de,
             "(std::is_same_v<T, absl::Cord> || std::is_same_v<T, RepeatedField<absl::Cord>>)");
  local_30 = (field->all_names_).payload_;
  local_38 = (ulong)*(ushort *)(local_30 + 2);
  local_28 = &local_38;
  local_30 = local_30 + ~local_38;
  local_18 = &local_48;
  local_48 = 0x1b;
  local_40 = "PN4absl12lts_202501274CordE";
  local_20 = absl::lts_20250127::str_format_internal::FormatArgImpl::
             Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
  local_10 = absl::lts_20250127::str_format_internal::FormatArgImpl::
             Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
  format_02.size_ = (size_t)&local_28;
  format_02.data_ = (void *)0x1e;
  args_02.len_ = in_R9;
  args_02.ptr_ = (pointer)0x2;
  absl::lts_20250127::str_format_internal::FormatPack_abi_cxx11_
            (&local_68,(str_format_internal *)"Invalid cast of %s to type %s.",format_02,args_02);
  absl::lts_20250127::log_internal::LogMessage::operator<<(&LStack_78,&local_68);
LAB_002b3c72:
  std::__cxx11::string::~string((string *)&local_68);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_78)
  ;
}

Assistant:

void Reflection::VerifyFieldType(const FieldDescriptor* field) const {
  if constexpr (!internal::PerformDebugChecks()) {
    return;
  }
  if constexpr (std::is_const_v<T>) {
    return VerifyFieldType<std::remove_const_t<T>>(field);
  }

  // `char` and `void` are used in places where we don't know the type yet.
  if constexpr (std::is_same_v<T, char> || std::is_same_v<T, void>) {
    return;
  }

  const auto error = [&] {
    return absl::StrFormat("Invalid cast of %s to type %s.", field->full_name(),
                           internal::RttiTypeName<T>().value_or("unknown"));
  };

  ABSL_DCHECK_EQ(field->is_repeated(), internal::IsRepeatedT<T>) << error();
  if constexpr (std::is_same_v<T, internal::MapFieldBase>) {
    ABSL_DCHECK(field->is_map()) << error();
  } else if constexpr (std::is_same_v<T, internal::RepeatedPtrFieldBase>) {
    // It has to be string or message.
    ABSL_DCHECK(field->cpp_type() == field->CPPTYPE_STRING ||
                field->cpp_type() == field->CPPTYPE_MESSAGE)
        << error();
  } else {
    auto cpp_type = field->cpp_type();
    // Collapse ENUM to INT32 because they are the same through reflection.
    if (cpp_type == field->CPPTYPE_ENUM) cpp_type = field->CPPTYPE_INT32;
    ABSL_DCHECK_EQ(+cpp_type, +internal::GetCppType<T>()) << error();

    // Check subfield types for message.
    if constexpr (internal::GetCppType<T>() ==
                  FieldDescriptor::CPPTYPE_MESSAGE) {
      // Singular/oneof messages are by pointer, except non-oneof Lazy.
      if (!field->is_repeated() &&
          (!IsLazyField(field) || field->real_containing_oneof() != nullptr)) {
        ABSL_DCHECK(std::is_pointer_v<T>) << error();
      }
    }

    // Check subfield types for string.
    if constexpr (internal::GetCppType<T>() ==
                  FieldDescriptor::CPPTYPE_STRING) {
      switch (field->cpp_string_type()) {
        case FieldDescriptor::CppStringType::kView:
        case FieldDescriptor::CppStringType::kString:
          if (IsMicroString(field)) {
            ABSL_DCHECK((std::is_same_v<T, internal::MicroString>)) << error();
          } else {
            ABSL_DCHECK((std::is_same_v<T, internal::ArenaStringPtr> ||
                         std::is_same_v<T, RepeatedPtrField<std::string>>))
                << error();
          }
          break;
        case FieldDescriptor::CppStringType::kCord:
          if (field->real_containing_oneof() != nullptr) {
            ABSL_DCHECK((std::is_same_v<T, absl::Cord*>)) << error();
          } else {
            ABSL_DCHECK((std::is_same_v<T, absl::Cord> ||
                         std::is_same_v<T, RepeatedField<absl::Cord>>))
                << error();
          }
          break;
      }
    }
  }
}